

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lazy_dependencies.pb.cc
# Opt level: O2

void proto2_unittest::lazy_imports::ImportedMessage::SharedDtor(MessageLite *self)

{
  LazyMessage *this;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (LazyMessage *)self[1]._internal_metadata_.ptr_;
    if (this != (LazyMessage *)0x0) {
      LazyMessage::~LazyMessage(this);
    }
    operator_delete(this,0x20);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lazy_dependencies.pb.cc"
             ,0xdd,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void ImportedMessage::SharedDtor(MessageLite& self) {
  ImportedMessage& this_ = static_cast<ImportedMessage&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.lazy_message_;
  this_._impl_.~Impl_();
}